

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O2

void __thiscall github111116::ConsoleLogger::warn<char[18]>(ConsoleLogger *this,char (*args) [18])

{
  if (2 < this->loglevel) {
    return;
  }
  std::mutex::lock(&this->mtx);
  if (this->colored == true) {
    std::operator<<(this->out,(string *)&this->warnColor);
  }
  std::operator<<(this->out,"[!] ");
  print<char[18]>(this,args);
  if (this->colored == true) {
    std::operator<<(this->out,"\x1b[0m");
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return;
}

Assistant:

void ConsoleLogger::warn(const Args&... args)
{
	if (loglevel > 2) return;
	mtx.lock();
	if (colored) out << warnColor;
	out << "[!] ";
	print(args...);
	if (colored) out << "\033[0m";
	mtx.unlock();
}